

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O1

bool __thiscall
cmLoadCacheCommand::ReadWithPrefix
          (cmLoadCacheCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  pointer pcVar2;
  undefined1 uVar3;
  undefined7 extraout_var;
  string *psVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  string *psVar6;
  bool bVar7;
  string line;
  string cacheFile;
  ifstream fin;
  char buffer [4096];
  long *local_12a8 [2];
  long local_1298 [2];
  char *local_1288;
  char *local_1280;
  char local_1278;
  undefined7 uStack_1277;
  undefined4 local_1264;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  long local_1240;
  long local_1238;
  byte abStack_1220 [488];
  string local_1038 [128];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"READ_WITH_PREFIX form must specify a prefix.","");
    cmCommand::SetError(&this->super_cmCommand,local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p,local_1038[0].field_2._M_allocated_capacity + 1
                     );
    }
    uVar3 = 0;
  }
  else {
    local_1260._M_dataplus._M_p = (pointer)&local_1260.field_2;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1260,pcVar2,pcVar2 + pbVar1->_M_string_length);
    std::__cxx11::string::append((char *)&local_1260);
    uVar3 = cmsys::SystemTools::FileExists(local_1260._M_dataplus._M_p);
    if ((bool)uVar3) {
      std::__cxx11::string::_M_assign((string *)&this->Prefix);
      local_1264 = (undefined4)CONCAT71(extraout_var,uVar3);
      this_00 = &this->VariablesToRead;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __v = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 3;
      local_1038[0]._M_dataplus._M_p = (pointer)this_00;
      if (__v != pbVar1) {
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,
                     (const_iterator)&(this->VariablesToRead)._M_t._M_impl.super__Rb_tree_header,__v
                     ,(_Alloc_node *)local_1038);
          __v = __v + 1;
        } while (__v != pbVar1);
      }
      std::ifstream::ifstream(&local_1240,local_1260._M_dataplus._M_p,_S_in);
      local_1288 = &local_1278;
      local_1280 = (char *)0x0;
      local_1278 = '\0';
      if ((abStack_1220[*(long *)(local_1240 + -0x18)] & 5) == 0) {
        do {
          std::istream::read((char *)&local_1240,(long)local_1038);
          if (local_1238 != 0) {
            psVar4 = (string *)((long)&local_1038[0]._M_dataplus._M_p + local_1238);
            psVar5 = local_1038;
            do {
              psVar6 = psVar5;
              if (*(char *)&(psVar5->_M_dataplus)._M_p == '\n') {
                bVar7 = false;
              }
              else {
                do {
                  psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
                  bVar7 = psVar6 == psVar4;
                  if (bVar7) break;
                } while (*(char *)&(psVar6->_M_dataplus)._M_p != '\n');
              }
              local_12a8[0] = local_1298;
              if ((psVar6 == psVar5) || (psVar6[-1].field_2._M_local_buf[0xf] != '\r')) {
                std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,psVar5,psVar6);
                std::__cxx11::string::_M_append((char *)&local_1288,(ulong)local_12a8[0]);
              }
              else {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_12a8,psVar5,
                           (undefined1 *)((long)&psVar6[-1].field_2 + 0xf));
                std::__cxx11::string::_M_append((char *)&local_1288,(ulong)local_12a8[0]);
              }
              if (local_12a8[0] != local_1298) {
                operator_delete(local_12a8[0],local_1298[0] + 1);
              }
              psVar5 = psVar6;
              if (!bVar7) {
                CheckLine(this,local_1288);
                std::__cxx11::string::_M_replace((ulong)&local_1288,0,local_1280,0x5e5069);
                psVar5 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
              }
            } while (psVar5 != psVar4);
          }
        } while ((abStack_1220[*(long *)(local_1240 + -0x18)] & 5) == 0);
      }
      if (local_1280 != (char *)0x0) {
        CheckLine(this,local_1288);
      }
      uVar3 = (undefined1)local_1264;
      if (local_1288 != &local_1278) {
        operator_delete(local_1288,CONCAT71(uStack_1277,local_1278) + 1);
      }
      std::ifstream::~ifstream(&local_1240);
    }
    else {
      std::operator+(local_1038,"Cannot load cache file from ",&local_1260);
      cmCommand::SetError(&this->super_cmCommand,local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
        operator_delete(local_1038[0]._M_dataplus._M_p,
                        local_1038[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
      operator_delete(local_1260._M_dataplus._M_p,local_1260.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool cmLoadCacheCommand::ReadWithPrefix(std::vector<std::string> const& args)
{
  // Make sure we have a prefix.
  if(args.size() < 3)
    {
    this->SetError("READ_WITH_PREFIX form must specify a prefix.");
    return false;
    }

  // Make sure the cache file exists.
  std::string cacheFile = args[0]+"/CMakeCache.txt";
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    std::string e = "Cannot load cache file from " + cacheFile;
    this->SetError(e);
    return false;
    }

  // Prepare the table of variables to read.
  this->Prefix = args[2];
  this->VariablesToRead.insert(args.begin() + 3, args.end());

  // Read the cache file.
  cmsys::ifstream fin(cacheFile.c_str());

  // This is a big hack read loop to overcome a buggy ifstream
  // implementation on HP-UX.  This should work on all platforms even
  // for small buffer sizes.
  const int bufferSize = 4096;
  char buffer[bufferSize];
  std::string line;
  while(fin)
    {
    // Read a block of the file.
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      // Parse for newlines directly.
      const char* i = buffer;
      const char* end = buffer+fin.gcount();
      while(i != end)
        {
        const char* begin = i;
        while(i != end && *i != '\n') { ++i; }
        if(i == begin || *(i-1) != '\r')
          {
          // Include this portion of the line.
          line += std::string(begin, i-begin);
          }
        else
          {
          // Include this portion of the line.
          // Don't include the \r in a \r\n pair.
          line += std::string(begin, i-1-begin);
          }
        if(i != end)
          {
          // Completed a line.
          this->CheckLine(line.c_str());
          line = "";

          // Skip the newline character.
          ++i;
          }
        }
      }
    }
  if(!line.empty())
    {
    // Partial last line.
    this->CheckLine(line.c_str());
    }

  return true;
}